

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

void cleanOSE(optionStackEntry *os)

{
  free(os->nextArg);
  os->nextArg = (char *)0x0;
  free(os->argv);
  os->argv = (poptArgv)0x0;
  free(os->argb);
  os->argb = (pbm_set *)0x0;
  return;
}

Assistant:

static void cleanOSE(struct optionStackEntry *os)
{
    os->nextArg = _free(os->nextArg);
    os->argv = _free(os->argv);
    os->argb = PBM_FREE(os->argb);
}